

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O2

void __thiscall OpenMD::SC::addType(SC *this,AtomType *atomType)

{
  size_t sVar1;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  AtomType *atomType2;
  CubicSpline *this_00;
  CubicSpline *this_01;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  SC *this_02;
  int k;
  int iVar8;
  long lVar9;
  int iVar10;
  RealType RVar11;
  RealType RVar12;
  RealType __y;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  RealType r;
  RealType local_110;
  RealType local_108;
  int atid;
  RealType local_f8;
  RealType local_f0;
  long local_e8;
  double local_e0;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> rvals;
  SuttonChenAdapter sca;
  
  sca.at_ = atomType;
  RVar11 = SuttonChenAdapter::getC(&sca);
  local_108 = SuttonChenAdapter::getM(&sca);
  local_f0 = SuttonChenAdapter::getN(&sca);
  RVar12 = SuttonChenAdapter::getAlpha(&sca);
  local_f8 = SuttonChenAdapter::getEpsilon(&sca);
  local_110 = RVar12 + RVar12;
  atid = AtomType::getIdent(atomType);
  sVar1 = (this->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->SCtypes,&atid);
  if (pVar13.second == false) {
    snprintf(painCave.errMsg,2000,"SC already had a previous entry with ident %d\n",
             (ulong)(uint)atid);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  iVar10 = (int)sVar1;
  (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[atid] = iVar10;
  lVar9 = (long)iVar10;
  pSVar2 = (this->SCdata).
           super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2[lVar9].c = RVar11;
  pSVar2[lVar9].m = local_108;
  pSVar2[lVar9].n = local_f0;
  pSVar2[lVar9].alpha = RVar12;
  pSVar2[lVar9].epsilon = local_f8;
  pSVar2[lVar9].rCut = local_110;
  std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar9,(long)this->nSC_);
  lVar5 = lVar9 * 0x48;
  for (p_Var6 = (this->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->SCtypes)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    local_e8 = (long)(this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)p_Var6[1]._M_color];
    atomType2 = ForceField::getAtomType(this->forceField_,p_Var6[1]._M_color);
    this_02 = this;
    RVar12 = getAlpha(this,atomType,atomType2);
    local_108 = getEpsilon(this_02,atomType,atomType2);
    local_f0 = getM(this_02,atomType,atomType2);
    __y = getN(this_02,atomType,atomType2);
    iVar8 = this->np_;
    rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    r = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)
               &rvals.super__Vector_base<double,_std::allocator<double>_>,&r);
    r = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vvals,&r);
    r = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)
               &phivals.super__Vector_base<double,_std::allocator<double>_>,&r);
    RVar11 = local_108;
    local_f8 = RVar12 + RVar12;
    local_110 = local_f8 / (double)(iVar8 + -1);
    for (iVar8 = 1; iVar8 < this->np_; iVar8 = iVar8 + 1) {
      r = (double)iVar8 * local_110;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &rvals.super__Vector_base<double,_std::allocator<double>_>,&r);
      local_e0 = pow(RVar12 / r,__y);
      local_e0 = local_e0 * local_108;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vvals,&local_e0);
      local_e0 = pow(RVar12 / r,local_f0);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)
                 &phivals.super__Vector_base<double,_std::allocator<double>_>,&local_e0);
    }
    local_110 = pow(RVar12 / local_f8,__y);
    this_00 = (CubicSpline *)operator_new(0xa0);
    CubicSpline::CubicSpline(this_00);
    CubicSpline::addPoints
              (this_00,(vector<double,_std::allocator<double>_> *)
                       &rvals.super__Vector_base<double,_std::allocator<double>_>,&vvals);
    this_01 = (CubicSpline *)operator_new(0xa0);
    CubicSpline::CubicSpline(this_01);
    CubicSpline::addPoints
              (this_01,(vector<double,_std::allocator<double>_> *)
                       &rvals.super__Vector_base<double,_std::allocator<double>_>,
               (vector<double,_std::allocator<double>_> *)
               &phivals.super__Vector_base<double,_std::allocator<double>_>);
    lVar4 = local_e8;
    std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_e8,(long)this->nSC_);
    lVar3 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].
                      super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar7 = local_e8 * 0x48;
    *(RealType *)(lVar3 + lVar7) = RVar12;
    *(RealType *)(lVar3 + 8 + lVar7) = RVar11;
    *(RealType *)(lVar3 + 0x10 + lVar7) = local_f0;
    *(RealType *)(lVar3 + 0x18 + lVar7) = __y;
    *(RealType *)(lVar3 + 0x20 + lVar7) = local_f8;
    *(double *)(lVar3 + 0x28 + lVar7) = local_108 * local_110;
    *(CubicSpline **)(lVar3 + 0x30 + lVar7) = this_00;
    *(CubicSpline **)(lVar3 + 0x38 + lVar7) = this_01;
    *(undefined1 *)(lVar3 + 0x40 + lVar7) = 0;
    if ((int)local_e8 != iVar10) {
      lVar3 = *(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                        ._M_impl.super__Vector_impl_data;
      *(RealType *)(lVar3 + lVar5) = RVar12;
      *(RealType *)(lVar3 + 8 + lVar5) = RVar11;
      *(RealType *)(lVar3 + 0x10 + lVar5) = local_f0;
      *(RealType *)(lVar3 + 0x18 + lVar5) = __y;
      *(RealType *)(lVar3 + 0x20 + lVar5) = local_f8;
      *(double *)(lVar3 + 0x28 + lVar5) = local_108 * local_110;
      *(CubicSpline **)(lVar3 + 0x30 + lVar5) = this_00;
      *(CubicSpline **)(lVar3 + 0x38 + lVar5) = this_01;
      *(undefined1 *)(lVar3 + 0x40 + lVar5) = 0;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&phivals.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vvals.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rvals.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void SC::addType(AtomType* atomType) {
    SuttonChenAdapter sca = SuttonChenAdapter(atomType);
    SCAtomData scAtomData;

    scAtomData.c       = sca.getC();
    scAtomData.m       = sca.getM();
    scAtomData.n       = sca.getN();
    scAtomData.alpha   = sca.getAlpha();
    scAtomData.epsilon = sca.getEpsilon();
    scAtomData.rCut    = 2.0 * scAtomData.alpha;

    // add it to the map:
    int atid  = atomType->getIdent();
    int sctid = SCtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = SCtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SC already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    SCtids[atid]  = sctid;
    SCdata[sctid] = scAtomData;
    MixingMap[sctid].resize(nSC_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = SCtypes.begin(); it != SCtypes.end(); ++it) {
      int sctid2       = SCtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      SCInteractionData mixer;

      mixer.alpha   = getAlpha(atomType, atype2);
      mixer.rCut    = 2.0 * mixer.alpha;
      mixer.epsilon = getEpsilon(atomType, atype2);
      mixer.m       = getM(atomType, atype2);
      mixer.n       = getN(atomType, atype2);

      RealType dr = mixer.rCut / (np_ - 1);
      vector<RealType> rvals;
      vector<RealType> vvals;
      vector<RealType> phivals;

      rvals.push_back(0.0);
      vvals.push_back(0.0);
      phivals.push_back(0.0);

      for (int k = 1; k < np_; k++) {
        RealType r = dr * k;
        rvals.push_back(r);
        vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
        phivals.push_back(pow(mixer.alpha / r, mixer.m));
      }

      mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

      CubicSpline* V = new CubicSpline();
      V->addPoints(rvals, vvals);

      CubicSpline* phi = new CubicSpline();
      phi->addPoints(rvals, phivals);

      mixer.V   = V;
      mixer.phi = phi;

      mixer.explicitlySet = false;

      MixingMap[sctid2].resize(nSC_);

      MixingMap[sctid][sctid2] = mixer;
      if (sctid2 != sctid) { MixingMap[sctid2][sctid] = mixer; }
    }
    return;
  }